

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifSat.c
# Opt level: O1

word If_ManSat6Truth(word uBound,word uFree,int *pBSet,int nBSet,int *pSSet,int nSSet,int *pFSet,
                    int nFSet)

{
  word wVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  word local_58 [5];
  
  uVar4 = 0;
  if (0 < nSSet) {
    do {
      local_58[uVar4] = s_Truths6[pSSet[uVar4]];
      uVar4 = uVar4 + 1;
    } while ((uint)nSSet != uVar4);
  }
  iVar3 = (int)uVar4;
  if (0 < nBSet) {
    uVar2 = 0;
    do {
      local_58[(uVar4 & 0xffffffff) + uVar2] = s_Truths6[pBSet[uVar2]];
      uVar2 = uVar2 + 1;
    } while ((uint)nBSet != uVar2);
    iVar3 = iVar3 + (int)uVar2;
  }
  local_58[0] = If_ManSat6ComposeLut4((uint)uBound & 0xffff,local_58,iVar3);
  if (nSSet < 1) {
    uVar4 = 1;
  }
  else {
    uVar2 = 1;
    do {
      local_58[uVar2] = s_Truths6[pSSet[uVar2 - 1]];
      uVar4 = uVar2 + 1;
      bVar5 = uVar2 != (uint)nSSet;
      uVar2 = uVar4;
    } while (bVar5);
  }
  iVar3 = (int)uVar4;
  if (0 < nFSet) {
    uVar2 = 0;
    do {
      local_58[(uVar4 & 0xffffffff) + uVar2] = s_Truths6[pFSet[uVar2]];
      uVar2 = uVar2 + 1;
    } while ((uint)nFSet != uVar2);
    iVar3 = iVar3 + (int)uVar2;
  }
  wVar1 = If_ManSat6ComposeLut4((uint)uFree & 0xffff,local_58,iVar3);
  return wVar1;
}

Assistant:

word If_ManSat6Truth( word uBound, word uFree, int * pBSet, int nBSet, int * pSSet, int nSSet, int * pFSet, int nFSet )
{
    word r, q, f[4];
    int i, k = 0;
    // bound set vars
    for ( i = 0; i < nSSet; i++ )
        f[k++] = s_Truths6[pSSet[i]];
    for ( i = 0; i < nBSet; i++ )
        f[k++] = s_Truths6[pBSet[i]];
    q = If_ManSat6ComposeLut4( (int)(uBound & 0xffff), f, k );
    // free set vars
    k = 0;
    f[k++] = q;
    for ( i = 0; i < nSSet; i++ )
        f[k++] = s_Truths6[pSSet[i]];
    for ( i = 0; i < nFSet; i++ )
        f[k++] = s_Truths6[pFSet[i]];
    r = If_ManSat6ComposeLut4( (int)(uFree & 0xffff), f, k );
    return r;
}